

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O2

void __thiscall
chrono::ChPhysicsItem::AddVisualModel(ChPhysicsItem *this,shared_ptr<chrono::ChVisualModel> *model)

{
  ChVisualModelInstance *this_00;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (ChVisualModelInstance *)::operator_new(0x18);
  std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             &model->super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
  ChVisualModelInstance::ChVisualModelInstance
            (this_00,(shared_ptr<chrono::ChVisualModel> *)&_Stack_48);
  std::__shared_ptr<chrono::ChVisualModelInstance,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChVisualModelInstance,void>
            ((__shared_ptr<chrono::ChVisualModelInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             this_00);
  std::__shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->vis_model_instance).
              super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>,
             &local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  ((this->vis_model_instance).
   super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_owner =
       this;
  return;
}

Assistant:

void ChPhysicsItem::AddVisualModel(std::shared_ptr<ChVisualModel> model) {
    vis_model_instance = std::shared_ptr<ChVisualModelInstance>(new ChVisualModelInstance(model));
    vis_model_instance->m_owner = this;
}